

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O1

void result_tests::ExpectSuccess<bilingual_str,bilingual_str>
               (Result<bilingual_str> *result,bilingual_str *str,bilingual_str *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  T *pTVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  T *local_170;
  T *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  lazy_ostream local_110;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  T **local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined1 *local_b8;
  T ***local_b0;
  T **local_a8;
  char *local_a0;
  char *local_98;
  assertion_result local_90;
  undefined **local_78;
  ulong local_70;
  undefined1 *local_68;
  T ***pppTStack_60;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<bilingual_str>(result,true,str);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x41;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(__index_type *)
         ((long)&(result->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
                 super__Move_assign_alias<bilingual_str,_bilingual_str>.
                 super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                 super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                 super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                 super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x40) == '\x01');
  local_a8 = &local_168;
  local_168 = (T *)CONCAT71(local_168._1_7_,
                            local_90.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  local_d0 = &local_170;
  local_170 = (T *)CONCAT71(local_170._1_7_,1);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_98 = "";
  pppTStack_60 = &local_a8;
  local_70 = local_70 & 0xffffffffffffff00;
  local_c0 = 0;
  local_78 = &PTR__lazy_ostream_013abe90;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &PTR__lazy_ostream_013abe90;
  local_b0 = &local_d0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xebea69,(size_t)&local_a0,0x41,&local_78,"true",
             &local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x42;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013abb30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (T ***)0xf6cf21;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_138 = "";
  pTVar2 = util::Result<bilingual_str>::value(result);
  local_78 = (undefined **)(args->original)._M_dataplus._M_p;
  paVar1 = &(args->original).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78 == paVar1) {
    local_68 = (undefined1 *)paVar1->_M_allocated_capacity;
    pppTStack_60 = *(T ****)((long)&(args->original).field_2 + 8);
    local_78 = &local_68;
  }
  else {
    local_68 = (undefined1 *)paVar1->_M_allocated_capacity;
  }
  local_70 = (args->original)._M_string_length;
  (args->original)._M_dataplus._M_p = (pointer)paVar1;
  (args->original)._M_string_length = 0;
  (args->original).field_2._M_local_buf[0] = '\0';
  local_58 = (size_type *)(args->translated)._M_dataplus._M_p;
  paVar1 = &(args->translated).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58 == paVar1) {
    local_48 = paVar1->_M_allocated_capacity;
    uStack_40 = *(undefined4 *)((long)&(args->translated).field_2 + 8);
    uStack_3c = *(undefined4 *)((long)&(args->translated).field_2 + 0xc);
    local_58 = &local_48;
  }
  else {
    local_48 = paVar1->_M_allocated_capacity;
  }
  local_50 = (args->translated)._M_string_length;
  (args->translated)._M_dataplus._M_p = (pointer)paVar1;
  (args->translated)._M_string_length = 0;
  (args->translated).field_2._M_local_buf[0] = '\0';
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_c8,&local_140,0x42,1,2,pTVar2,"result.value()",&local_78,
             "T{std::forward<Args>(args)...}");
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,(ulong)(local_68 + 1));
  }
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_150;
  msg_01.m_end = (iterator)pTVar2;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
             msg_01);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_168 = util::Result<bilingual_str>::value(result);
  local_170 = util::Result<bilingual_str>::value(result);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_168 == local_170);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_98 = "";
  local_a8 = &local_168;
  local_70 = local_70 & 0xffffffffffffff00;
  local_78 = &PTR__lazy_ostream_013aeb58;
  local_68 = boost::unit_test::lazy_ostream::inst;
  pppTStack_60 = &local_a8;
  local_d0 = &local_170;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013aeb58;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_110,1,2,REQUIRE,0xebea9b,(size_t)&local_a0,0x43,&local_78,"&*result",
             &local_c8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}